

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

void bcm2835_i2c_setSlaveAddress(uint8_t addr)

{
  uint32_t *paddr;
  uint8_t addr_local;
  
  bcm2835_peri_write(bcm2835_bsc1 + 3,(uint)addr);
  return;
}

Assistant:

void bcm2835_i2c_setSlaveAddress(uint8_t addr)
{
    /* Set I2C Device Address */
#ifdef I2C_V1
    volatile uint32_t* paddr = bcm2835_bsc0 + BCM2835_BSC_A/4;
#else	
    volatile uint32_t* paddr = bcm2835_bsc1 + BCM2835_BSC_A/4;
#endif
    bcm2835_peri_write(paddr, addr);
}